

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ArrayColumnData::InitializeColumn
          (ArrayColumnData *this,PersistentColumnData *column_data,BaseStatistics *target_stats)

{
  reference pvVar1;
  BaseStatistics *pBVar2;
  pointer pCVar3;
  
  pvVar1 = vector<duckdb::PersistentColumnData,_true>::get<true>(&column_data->child_columns,0);
  ColumnData::InitializeColumn(&(this->validity).super_ColumnData,pvVar1,target_stats);
  pBVar2 = ArrayStats::GetChildStats(target_stats);
  pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  pvVar1 = vector<duckdb::PersistentColumnData,_true>::get<true>(&column_data->child_columns,1);
  (*pCVar3->_vptr_ColumnData[0x20])(pCVar3,pvVar1,pBVar2);
  LOCK();
  (this->super_ColumnData).count.super___atomic_base<unsigned_long>._M_i =
       (this->validity).super_ColumnData.count.super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  return;
}

Assistant:

void ArrayColumnData::InitializeColumn(PersistentColumnData &column_data, BaseStatistics &target_stats) {
	D_ASSERT(column_data.pointers.empty());
	validity.InitializeColumn(column_data.child_columns[0], target_stats);
	auto &child_stats = ArrayStats::GetChildStats(target_stats);
	child_column->InitializeColumn(column_data.child_columns[1], child_stats);
	this->count = validity.count.load();
}